

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_CommandLogging.cpp
# Opt level: O1

void __thiscall
RenX_CommandLoggingPlugin::WriteToLog
          (RenX_CommandLoggingPlugin *this,Server *server,PlayerInfo *player,string_view message)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  char cVar3;
  undefined8 *puVar4;
  char *__s;
  size_t sVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  PrepFile(this);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    puVar4 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
    RenX::Server::getSocketPort();
    puVar9 = &this->field_0xd0;
    __s = (char *)getTimeFormat("%T");
    if (__s == (char *)0x0) {
      std::ios::clear((int)puVar9 + (int)*(undefined8 *)(*(long *)puVar9 + -0x18));
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar9,__s,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar9," ",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar9,(char *)*puVar4,puVar4[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    uVar1 = player->access;
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00108b72;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00108b72;
        }
        if (uVar7 < 10000) goto LAB_00108b72;
        uVar8 = uVar8 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_00108b72:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_50,(ulong)(-((int)uVar1 >> 0x1f) + __len),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),__len,__val);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(player->name)._M_dataplus._M_p,(player->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,message._M_str,message._M_len);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void RenX_CommandLoggingPlugin::WriteToLog(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message) {
	// Check if new file needs to be opened
	PrepFile();

	if (!fs.is_open()) {
		return;
	}

	const std::string& serverHostname = server.getSocketHostname();
	unsigned short serverPort = server.getSocketPort();

	fs << getTimeFormat("%T")
		<< " "
		<< serverHostname
		<< ":"
		<< serverPort
		<< " "
		<< std::to_string(player.access)
		<< " "
		<< player.name
		<< ": "
		<< message
		<< std::endl;
}